

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68000_asr_r_8(m68k_info *info)

{
  uint uVar1;
  
  MCInst_setOpcode(info->inst,10);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x1;
  (info->extension).operands[0].address_mode = M68K_AM_REG_DIRECT_DATA;
  uVar1 = info->ir;
  (info->extension).operands[0].field_0.reg = (uVar1 >> 9 & 7) + M68K_REG_D0;
  (info->extension).operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
  (info->extension).operands[1].field_0.reg = (uVar1 & 7) + M68K_REG_D0;
  return;
}

Assistant:

static void d68000_asr_r_8(m68k_info *info)
{
	build_r(info, M68K_INS_ASR, 1);
}